

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

int unz64local_getLong(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  int iVar1;
  int iVar2;
  uLong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int i;
  uLong *local_38;
  
  i = 0;
  local_38 = pX;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
  uVar6 = (ulong)i;
  iVar2 = -1;
  iVar5 = i;
  iVar4 = i;
  if (((iVar1 == 0) &&
      (iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i), iVar4 = i, iVar5 = i,
      iVar1 == 0)) &&
     (iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i), iVar5 = i, iVar1 == 0)) {
    iVar2 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
  }
  uVar3 = 0;
  if (iVar2 == 0) {
    uVar3 = (long)i * 0x1000000 + ((long)iVar5 << 0x10 | (long)iVar4 << 8 | uVar6);
  }
  *local_38 = uVar3;
  return iVar2;
}

Assistant:

local int unz64local_getLong(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x += ((uLong)i) << 24;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}